

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O2

bool __thiscall ON_PolyCurve::IsPlanar(ON_PolyCurve *this,ON_Plane *plane,double tolerance)

{
  ON_Curve *pOVar1;
  ON_3dPoint from_pt;
  ON_3dPoint to_pt;
  bool bVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  char cVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  ON_Plane *pOVar10;
  ON_Plane *pOVar11;
  uint uVar12;
  byte bVar13;
  undefined4 uVar14;
  double in_XMM1_Qa;
  double dVar15;
  double local_1c0;
  ON_3dPoint best_Y;
  ON_3dVector Y;
  ON_3dVector X;
  ON_3dPoint R;
  ON_Line line;
  ON_Interval d;
  ON_3dPoint local_e0;
  ON_3dPoint local_c8;
  ON_Plane test_plane;
  
  bVar13 = 0;
  iVar3 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])();
  if (iVar3 == 2) {
    bVar2 = ON_Curve::IsPlanar(&this->super_ON_Curve,plane,tolerance);
    return bVar2;
  }
  ON_Plane::ON_Plane(&test_plane);
  iVar3 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  if (0 < (long)iVar3) {
    pOVar1 = *(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a;
    uVar14 = SUB84(tolerance,0);
    if (pOVar1 != (ON_Curve *)0x0 && iVar3 == 1) {
      iVar3 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x32])
                        (uVar14,pOVar1,plane);
      cVar6 = (char)iVar3;
      goto LAB_00592a99;
    }
    if (iVar3 != 1) {
      iVar4 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2e])
                        (uVar14,this);
      if ((char)iVar4 != '\0') {
        cVar6 = '\x01';
        if (plane != (ON_Plane *)0x0) {
          ON_Curve::PointAtStart(&local_c8,&this->super_ON_Curve);
          ON_Curve::PointAtEnd(&local_e0,&this->super_ON_Curve);
          from_pt.y = local_c8.y;
          from_pt.x = local_c8.x;
          from_pt.z = local_c8.z;
          to_pt.y = local_e0.y;
          to_pt.x = local_e0.x;
          to_pt.z = local_e0.z;
          ON_Line::ON_Line(&line,from_pt,to_pt);
          bVar2 = ON_Line::InPlane(&line,plane,tolerance);
          if (!bVar2) {
            ON_Line::InPlane(&line,plane,0.0);
          }
          ON_Line::~ON_Line(&line);
        }
        goto LAB_00592a99;
      }
      (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
      d.m_t[1] = in_XMM1_Qa;
      pdVar5 = ON_Interval::operator[](&d,0);
      bVar2 = ON_Curve::Ev1Der(&this->super_ON_Curve,*pdVar5,&line.from,&X,0,(int *)0x0);
      if (bVar2) {
        bVar2 = ON_3dVector::Unitize(&X);
        if (bVar2) {
          ON_3dPoint::operator+(&best_Y,&line.from,&X);
          best_Y.z = ON_3dPoint::Origin.z;
          best_Y.x = ON_3dPoint::Origin.x;
          best_Y.y = ON_3dPoint::Origin.y;
          local_1c0 = 1.0;
          for (uVar12 = 2; uVar12 < 0x11; uVar12 = uVar12 + 2) {
            for (uVar8 = 1; uVar8 < uVar12; uVar8 = uVar8 + 2) {
              dVar15 = ON_Interval::ParameterAt(&d,(double)(int)uVar8 / (double)(int)uVar12);
              ON_Curve::PointAt((ON_3dPoint *)&Y,&this->super_ON_Curve,dVar15);
              R.z = Y.z;
              R.x = Y.x;
              R.y = Y.y;
              ON_3dPoint::operator-(&Y,&R,&line.from);
              bVar2 = ON_3dVector::Unitize(&Y);
              if (bVar2) {
                iVar4 = ON_3dVector::IsParallelTo(&X,&Y,0.017453292519943295);
                if (iVar4 == 0) {
                  bVar2 = ON_Plane::CreateFromFrame(&test_plane,&line.from,&X,&Y);
                  if (bVar2) goto LAB_00592db0;
                }
                else {
                  dVar15 = ON_3dVector::operator*(&X,&Y);
                  dVar15 = ABS(dVar15);
                  in_XMM1_Qa = dVar15;
                  if (dVar15 < local_1c0) {
                    ON_3dPoint::operator=(&best_Y,&Y);
                    local_1c0 = dVar15;
                  }
                }
              }
            }
          }
          if (local_1c0 < 1.0) {
            ON_3dVector::ON_3dVector(&Y,&best_Y);
            bVar2 = ON_Plane::CreateFromFrame(&test_plane,&line.from,&X,&Y);
            if (bVar2) {
LAB_00592db0:
              iVar3 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                        [0x33])(uVar14,this,&test_plane);
              cVar6 = (char)iVar3;
              if (cVar6 == '\x01' && plane != (ON_Plane *)0x0) {
                pOVar10 = &test_plane;
                pOVar11 = plane;
                for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
                  (pOVar11->origin).x = (pOVar10->origin).x;
                  pOVar10 = (ON_Plane *)((long)pOVar10 + (ulong)bVar13 * -0x10 + 8);
                  pOVar11 = (ON_Plane *)((long)pOVar11 + (ulong)bVar13 * -0x10 + 8);
                }
                iVar3 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                          [0x34])(this);
                cVar6 = '\x01';
                if ((char)iVar3 != '\0') {
                  iVar3 = ON_ClosedCurveOrientation(&this->super_ON_Curve,plane);
                  if (iVar3 < 0) {
                    ON_Plane::Flip(plane);
                  }
                }
              }
              goto LAB_00592a99;
            }
          }
        }
      }
      bVar2 = ON_Curve::Ev1Der(&this->super_ON_Curve,*(this->m_t).m_a,&line.from,&X,0,(int *)0x0);
      if (bVar2) {
        bVar2 = ON_3dVector::Unitize(&X);
        if (!bVar2) {
          (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
          d.m_t[1] = in_XMM1_Qa;
          dVar15 = ON_Interval::ParameterAt(&d,0.5);
          ON_Curve::PointAt((ON_3dPoint *)&Y,&this->super_ON_Curve,dVar15);
          ON_3dPoint::operator-((ON_3dVector *)&best_Y,(ON_3dPoint *)&Y,&line.from);
          X.z = best_Y.z;
          X.x = best_Y.x;
          X.y = best_Y.y;
          bVar2 = ON_3dVector::Unitize(&X);
          if (!bVar2) goto LAB_00592a97;
        }
        for (uVar9 = 1; uVar9 < (ulong)(long)iVar3; uVar9 = uVar9 + 1) {
          pOVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar9];
          if (pOVar1 != (ON_Curve *)0x0) {
            (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(pOVar1);
            Y.y = in_XMM1_Qa;
            dVar15 = ON_Interval::ParameterAt((ON_Interval *)&Y,0.5);
            ON_Curve::PointAt(&best_Y,pOVar1,dVar15);
            R.z = best_Y.z;
            R.x = best_Y.x;
            R.y = best_Y.y;
            ON_3dPoint::operator-((ON_3dVector *)&best_Y,&R,&line.from);
            bVar2 = ON_Plane::CreateFromFrame(&test_plane,&line.from,&X,(ON_3dVector *)&best_Y);
            if (bVar2) goto LAB_00592db0;
          }
        }
      }
    }
  }
LAB_00592a97:
  cVar6 = '\0';
LAB_00592a99:
  ON_Plane::~ON_Plane(&test_plane);
  return (bool)cVar6;
}

Assistant:

bool
ON_PolyCurve::IsPlanar(
      ON_Plane* plane, // if not nullptr and true is returned, then plane parameters
                         // are filled in
      double tolerance // tolerance to use when checking linearity
      ) const
{
  if ( Dimension() == 2 )
  {
    return ON_Curve::IsPlanar(plane,tolerance);
  }

  bool rc = false;
  ON_Plane test_plane;
  const int count = Count();
  const ON_Curve* crv = FirstSegmentCurve();
  if ( count == 1 && crv )
    rc = crv->IsPlanar( plane, tolerance );
  else if ( count > 1 )
  {
    if ( IsLinear(tolerance) )
    {
      if ( plane )
      {
        ON_Line line(PointAtStart(), PointAtEnd() );
        if ( !line.InPlane( *plane, tolerance ) )
          line.InPlane( *plane, 0.0 );
      }
      return true;
    }
    if ( !GetTestPlane( *this, test_plane ) )
    {
      // 5 May 2006 Dale Lear
      //   Added additional attempts to get a test_plane
      //   for poorly parameterized polycurves. (RR 20057 fix).
      ON_3dPoint P, Q;
      ON_3dVector X;
      if (!Ev1Der(m_t[0],P,X))
        return false;

      if ( !X.Unitize() )
      {
        X = PointAt(Domain().ParameterAt(0.5)) - P;
        if ( !X.Unitize() )
          return false;
      }

      int i;
      for ( i = 1; i < count; i++ )
      {
        if ( m_segment[i] )
        {
          Q = m_segment[i]->PointAt(m_segment[i]->Domain().ParameterAt(0.5));
          if ( test_plane.CreateFromFrame(P,X,Q-P) )
            break;
        }
      }
      if ( i >= count )
        return false;
    }
    rc = IsInPlane( test_plane, tolerance );
    if (rc && plane)
      *plane = test_plane;

    // RH-75060 GBA 9-June-23 
     // For a planar simple closed curve we should return the plane
     // whose orientation that matches the curve orientation.
    if (rc && plane && IsClosed())
    {
      if (ON_ClosedCurveOrientation(*this, *plane) < 0)
        plane->Flip();
    }
  }
  return rc;
}